

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prod_tests1.cpp
# Opt level: O2

void __thiscall
test::iu_PeepClassTest_x_iutest_x_ScopedPeep_Test::iu_PeepClassTest_x_iutest_x_ScopedPeep_Test
          (iu_PeepClassTest_x_iutest_x_ScopedPeep_Test *this)

{
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0039a618;
  return;
}

Assistant:

IUTEST(PeepClassTest, ScopedPeep)
{
    {
        IUTEST_PEEP(prod_test::ProdClass, m_z) prod_class_z(&prod_test::s_prod);
        prod_class_z = 5;
        IUTEST_EXPECT_EQ(5, prod_test::s_prod.GetZ());

        IUTEST_EXPECT_EQ(5, prod_class_z);
    }
    {
        IUTEST_PEEP(prod_test::ProdClass, m_z) prod_class_z(&prod_test::s_prod);
        prod_class_z = 5;
        IUTEST_EXPECT_EQ(5, prod_test::s_prod.GetZ());

        IUTEST_EXPECT_EQ(5, prod_class_z);
    }
}